

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

int __thiscall
CTcSymProp::gen_code_asi
          (CTcSymProp *this,int discard,int phase,tc_asitype_t typ,char *param_4,CTcPrsNode *rhs,
          int param_6,int param_7,void **param_8)

{
  int iVar1;
  int iVar2;
  CTcGenTarg *this_00;
  
  if ((G_cs->field_0xa8 & 1) == 0) {
    if (phase == 1) {
      CTcTokenizer::log_error
                (0x2cfb,(ulong)(uint)(this->super_CTcSymPropBase).super_CTcSymbol.
                                     super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
                                     len_,
                 (this->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.
                 super_CVmHashEntryCS.super_CVmHashEntry.str_);
    }
  }
  else {
    if (typ == TC_ASI_SIMPLE) {
      if (rhs != (CTcPrsNode *)0x0) {
        (**(rhs->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(rhs,0,0);
      }
    }
    else if (phase != 2) {
      if (phase != 1) {
        return 0;
      }
      (*(this->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
        super_CVmHashEntry._vptr_CVmHashEntry[0x18])(this,0);
      return 0;
    }
    this_00 = G_cg;
    if (discard == 0) {
      CTcGenTarg::write_op(G_cg,0x88);
      this_00 = G_cg;
      iVar2 = G_cg->sp_depth_;
      iVar1 = iVar2 + 1;
      G_cg->sp_depth_ = iVar1;
      if (this_00->max_sp_depth_ <= iVar2) {
        this_00->max_sp_depth_ = iVar1;
      }
    }
    CTcGenTarg::write_op(this_00,0xe7);
    CTcDataStream::write_prop_id
              (&G_cs->super_CTcDataStream,(uint)(this->super_CTcSymPropBase).prop_);
    G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
  }
  return 1;
}

Assistant:

int CTcSymProp::gen_code_asi(int discard, int phase,
                             tc_asitype_t typ, const char *,
                             class CTcPrsNode *rhs,
                             int /*ignore_errors*/, int /*explicit*/,
                             void ** /*ctx*/)
{
    /* if there's no "self" object, we can't make this assignment */
    if (!G_cs->is_self_available())
    {
        /* log an error if it's phase 1 */
        if (phase == 1)
            G_tok->log_error(TCERR_SETPROP_NEEDS_OBJ,
                             (int)get_sym_len(), get_sym());

        /* 
         *   indicate that we're finished, since there's nothing more we
         *   can do here 
         */
        return TRUE;
    }

    /* check what we're doing */
    if (typ == TC_ASI_SIMPLE)
    {
        /* 
         *   Simple assignment.  Generate the right-hand side's expression
         *   for assignment, unless the caller has already done so.
         */
        if (rhs != 0)
            rhs->gen_code(FALSE, FALSE);

        /* 
         *   if we're not discarding the value, make a copy - we'll consume a
         *   copy in the SETPROP instruction, so we need one more copy to
         *   return to the enclosing expression 
         */
        if (!discard)
        {
            G_cg->write_op(OPC_DUP);
            G_cg->note_push();
        }
        
        /* 
         *   write the SETPROP instruction - use the special form to assign
         *   to "self" 
         */
        G_cg->write_op(OPC_SETPROPSELF);
        G_cs->write_prop_id(prop_);
        
        /* setpropself removes the value */
        G_cg->note_pop();

        /* handled */
        return TRUE;
    }
    else if (phase == 1)
    {
        /* 
         *   Phase 1 of a compound assignment.  Generate the property value
         *   so that the compound operator can combine it with the RHS. 
         */
        gen_code(FALSE);

        /* proceed with the unrolled assignment */
        return FALSE;
    }
    else if (phase == 2)
    {
        /* 
         *   Phase 2 of a compound assignment.  The combined value of
         *   (self.prop <op> RHS) is on the stack, so complete the
         *   assignment.  
         */

        /* if the caller will want to use the RHS value, make a copy */
        if (!discard)
        {
            G_cg->write_op(OPC_DUP);
            G_cg->note_push();
        }

        /* write the SETPROP */
        G_cg->write_op(OPC_SETPROPSELF);
        G_cs->write_prop_id(prop_);

        /* setpropself removes the value */
        G_cg->note_pop();

        /* done */
        return TRUE;
    }
    else
    {
        /* other phases aren't handled */
        return FALSE;
    }
}